

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

void Iso_ManPrintClasses(Iso_Man_t *p,int fVerbose,int fVeryVerbose)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Iso_Obj_t *q;
  Aig_Obj_t *pAVar6;
  uint i;
  ulong uVar7;
  Aig_Obj_t *pAVar8;
  
  if (fVerbose != 0) {
    printf("Total objects =%7d.  Entries =%7d.  Classes =%7d.  Singles =%7d.\n",
           (ulong)(uint)p->nObjs,(ulong)(uint)p->nEntries,(ulong)(uint)p->nClasses,
           (ulong)(uint)p->nSingles);
  }
  if (fVeryVerbose != 0) {
    puts("Non-trivial classes:");
    for (i = 0; (int)i < p->vClasses->nSize; i = i + 1) {
      q = (Iso_Obj_t *)Vec_PtrEntry(p->vClasses,i);
      printf("%5d : {",(ulong)i);
      for (; q != (Iso_Obj_t *)0x0; q = Iso_ManObj(p,q->iClass)) {
        pAVar6 = Iso_AigObj(p,q);
        uVar4 = *(uint *)&pAVar6->field_0x18;
        uVar3 = Iso_ObjId(p,q);
        if ((uVar4 & 7) - 7 < 0xfffffffe) {
          printf(" %d",(ulong)uVar3);
        }
        else {
          pAVar8 = pAVar6->pFanin0;
          pcVar1 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
          if (((ulong)pAVar8 & 1) == 0) {
            pcVar1 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
          }
          if (pAVar8 == (Aig_Obj_t *)0x0) {
            pAVar8 = (Aig_Obj_t *)0x0;
            uVar4 = 0xffffffff;
          }
          else {
            pAVar8 = (Aig_Obj_t *)((ulong)pAVar8 & 0xfffffffffffffffe);
            uVar4 = pAVar8->Id;
          }
          uVar5 = Aig_ObjLevel(pAVar8);
          pAVar6 = pAVar6->pFanin1;
          pcVar2 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
          if (((ulong)pAVar6 & 1) == 0) {
            pcVar2 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
          }
          if (pAVar6 == (Aig_Obj_t *)0x0) {
            pAVar6 = (Aig_Obj_t *)0x0;
            uVar7 = 0xffffffff;
          }
          else {
            pAVar6 = (Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe);
            uVar7 = (ulong)(uint)pAVar6->Id;
          }
          Aig_ObjLevel(pAVar6);
          printf(" %d{%s%d(%d),%s%d(%d)}",(ulong)uVar3,pcVar1 + 0x4a,(ulong)uVar4,(ulong)uVar5,
                 pcVar2 + 0x4a,uVar7);
        }
        printf("(%d)",(ulong)(*(uint *)q & 0x3fffffff));
      }
      puts(" }");
    }
  }
  return;
}

Assistant:

void Iso_ManPrintClasses( Iso_Man_t * p, int fVerbose, int fVeryVerbose )
{
    int fOnlyCis = 0;
    Iso_Obj_t * pIso, * pTemp;
    int i;

    // count unique objects
    if ( fVerbose )
        printf( "Total objects =%7d.  Entries =%7d.  Classes =%7d.  Singles =%7d.\n", 
            p->nObjs, p->nEntries, p->nClasses, p->nSingles );

    if ( !fVeryVerbose )
        return;

    printf( "Non-trivial classes:\n" );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        if ( fOnlyCis && pIso->Level > 0 )
            continue;

        printf( "%5d : {", i );
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
        {
            if ( fOnlyCis )
                printf( " %d", Aig_ObjCioId( Iso_AigObj(p, pTemp) ) );
            else
            {
                Aig_Obj_t * pObj = Iso_AigObj(p, pTemp);
                if ( Aig_ObjIsNode(pObj) )
                    printf( " %d{%s%d(%d),%s%d(%d)}", Iso_ObjId(p, pTemp), 
                        Aig_ObjFaninC0(pObj)? "-": "+", Aig_ObjFaninId0(pObj), Aig_ObjLevel(Aig_ObjFanin0(pObj)), 
                        Aig_ObjFaninC1(pObj)? "-": "+", Aig_ObjFaninId1(pObj), Aig_ObjLevel(Aig_ObjFanin1(pObj)) );
                else
                    printf( " %d", Iso_ObjId(p, pTemp) );
            }
            printf( "(%d)", pTemp->Level );
        }        
        printf( " }\n" );
    }
}